

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O0

void cpu_put_psr_raw_sparc(CPUSPARCState *env,target_ulong_conflict val)

{
  target_ulong_conflict val_local;
  CPUSPARCState *env_local;
  
  env->psr = val & 0xf00000;
  env->psref = (uint)((val & 0x1000) != 0);
  env->psrpil = (val & 0xf00) >> 8;
  env->psrs = (uint)((val & 0x80) != 0);
  env->psrps = (uint)((val & 0x40) != 0);
  env->psret = (uint)((val & 0x20) != 0);
  env->cc_op = 1;
  cpu_set_cwp_sparc(env,val & 0x1f);
  return;
}

Assistant:

void cpu_put_psr_raw(CPUSPARCState *env, target_ulong val)
{
    env->psr = val & PSR_ICC;
#if !defined(TARGET_SPARC64)
    env->psref = (val & PSR_EF) ? 1 : 0;
    env->psrpil = (val & PSR_PIL) >> 8;
    env->psrs = (val & PSR_S) ? 1 : 0;
    env->psrps = (val & PSR_PS) ? 1 : 0;
    env->psret = (val & PSR_ET) ? 1 : 0;
#endif
    env->cc_op = CC_OP_FLAGS;
#if !defined(TARGET_SPARC64)
    cpu_set_cwp(env, val & PSR_CWP);
#endif
}